

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bignum.cc
# Opt level: O2

void TestShiftLeft(void)

{
  bool bVar1;
  undefined1 in_CL;
  undefined1 uVar2;
  char *pcVar3;
  char *in_R8;
  char *in_R9;
  Bignum bignum;
  char buffer [1024];
  
  bignum.used_bigits_ = 0;
  bignum.exponent_ = 0;
  AssignHexString(&bignum,"0");
  double_conversion::Bignum::ShiftLeft(&bignum,100);
  bVar1 = double_conversion::Bignum::ToHexString(&bignum,buffer,0x400);
  CheckHelper((char *)0x7d,0xc0802c,(char *)(ulong)bVar1,(bool)in_CL);
  pcVar3 = buffer;
  CheckEqualsHelper((char *)0x7e,0xc08054,"0",buffer,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  AssignHexString(&bignum,"1");
  double_conversion::Bignum::ShiftLeft(&bignum,1);
  bVar1 = double_conversion::Bignum::ToHexString(&bignum,buffer,0x400);
  CheckHelper((char *)0x82,0xc0802c,(char *)(ulong)bVar1,(bool)uVar2);
  pcVar3 = buffer;
  CheckEqualsHelper((char *)0x83,0xc08162,"2",buffer,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  AssignHexString(&bignum,"1");
  double_conversion::Bignum::ShiftLeft(&bignum,4);
  bVar1 = double_conversion::Bignum::ToHexString(&bignum,buffer,0x400);
  CheckHelper((char *)0x87,0xc0802c,(char *)(ulong)bVar1,(bool)uVar2);
  pcVar3 = buffer;
  CheckEqualsHelper((char *)0x88,0xc08166,"10",buffer,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  AssignHexString(&bignum,"1");
  double_conversion::Bignum::ShiftLeft(&bignum,0x20);
  bVar1 = double_conversion::Bignum::ToHexString(&bignum,buffer,0x400);
  CheckHelper((char *)0x8c,0xc0802c,(char *)(ulong)bVar1,(bool)uVar2);
  pcVar3 = buffer;
  CheckEqualsHelper((char *)0x8d,0xc0816b,"100000000",buffer,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  AssignHexString(&bignum,"1");
  double_conversion::Bignum::ShiftLeft(&bignum,0x40);
  bVar1 = double_conversion::Bignum::ToHexString(&bignum,buffer,0x400);
  CheckHelper((char *)0x91,0xc0802c,(char *)(ulong)bVar1,(bool)uVar2);
  pcVar3 = buffer;
  CheckEqualsHelper((char *)0x92,0xc08177,"10000000000000000",buffer,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  AssignHexString(&bignum,"123456789ABCDEF");
  double_conversion::Bignum::ShiftLeft(&bignum,0x40);
  bVar1 = double_conversion::Bignum::ToHexString(&bignum,buffer,0x400);
  CheckHelper((char *)0x96,0xc0802c,(char *)(ulong)bVar1,(bool)uVar2);
  pcVar3 = buffer;
  CheckEqualsHelper((char *)0x97,0xc0819b,"123456789ABCDEF0000000000000000",buffer,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  double_conversion::Bignum::ShiftLeft(&bignum,1);
  bVar1 = double_conversion::Bignum::ToHexString(&bignum,buffer,0x400);
  CheckHelper((char *)0x99,0xc0802c,(char *)(ulong)bVar1,(bool)uVar2);
  CheckEqualsHelper((char *)0x9a,0xc081dd,"2468ACF13579BDE0000000000000000",buffer,in_R8,in_R9);
  return;
}

Assistant:

TEST(ShiftLeft) {
  char buffer[kBufferSize];
  Bignum bignum;
  AssignHexString(&bignum, "0");
  bignum.ShiftLeft(100);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("0", buffer);

  AssignHexString(&bignum, "1");
  bignum.ShiftLeft(1);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("2", buffer);

  AssignHexString(&bignum, "1");
  bignum.ShiftLeft(4);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("10", buffer);

  AssignHexString(&bignum, "1");
  bignum.ShiftLeft(32);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("100000000", buffer);

  AssignHexString(&bignum, "1");
  bignum.ShiftLeft(64);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("10000000000000000", buffer);

  AssignHexString(&bignum, "123456789ABCDEF");
  bignum.ShiftLeft(64);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("123456789ABCDEF0000000000000000", buffer);
  bignum.ShiftLeft(1);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("2468ACF13579BDE0000000000000000", buffer);
}